

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,float *scaleFactors,int startPattern,int endPattern)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  float *pfVar8;
  float *pfVar9;
  uint uVar10;
  float *pfVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  ulong uVar16;
  float *pfVar17;
  int i;
  ulong uVar18;
  long lVar19;
  float oneOverScaleFactor;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int local_c4;
  long local_c0;
  float *local_b8;
  float *local_b0;
  float *local_a0;
  float *local_98;
  
  iVar2 = this->kCategoryCount;
  if (0 < (long)iVar2) {
    uVar3 = this->kStateCount;
    iVar4 = this->kPartialsPaddedStateCount;
    iVar5 = this->kPatternCount;
    iVar6 = this->kMatrixSize;
    local_c0 = 0;
    uVar10 = uVar3 + 1;
    uVar7 = uVar3 + 3;
    if (-1 < (int)uVar3) {
      uVar7 = uVar3;
    }
    local_c4 = iVar4 * startPattern;
    local_98 = matrices2 + 2;
    local_a0 = matrices1 + 2;
    local_b8 = matrices1;
    local_b0 = matrices2;
    do {
      if (startPattern < endPattern) {
        pfVar13 = partials1 + local_c4;
        pfVar8 = partials2 + local_c4;
        pfVar15 = destP + (iVar5 * (int)local_c0 + startPattern) * iVar4;
        lVar12 = (long)startPattern;
        do {
          if (0 < (int)uVar3) {
            uVar18 = 0;
            fVar1 = scaleFactors[lVar12];
            pfVar9 = local_b8;
            pfVar11 = local_98;
            pfVar14 = local_a0;
            pfVar17 = local_b0;
            do {
              auVar20 = ZEXT816(0) << 0x40;
              uVar16 = 0;
              if (3 < (int)uVar3) {
                do {
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = *(ulong *)(pfVar14 + (uVar16 - 2));
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = *(ulong *)(pfVar13 + uVar16);
                  auVar23._8_8_ = 0;
                  auVar23._0_8_ = *(ulong *)(pfVar14 + uVar16);
                  auVar26._8_8_ = 0;
                  auVar26._0_8_ = *(ulong *)(pfVar13 + uVar16 + 2);
                  auVar21 = vmovhps_avx(auVar21,*(undefined8 *)(pfVar11 + (uVar16 - 2)));
                  auVar25 = vmovhps_avx(auVar25,*(undefined8 *)(pfVar8 + uVar16));
                  auVar25 = vfmadd213ps_fma(auVar25,auVar21,auVar20);
                  auVar20 = vmovhps_avx(auVar23,*(undefined8 *)(pfVar11 + uVar16));
                  auVar21 = vmovhps_avx(auVar26,*(undefined8 *)(pfVar8 + uVar16 + 2));
                  uVar16 = uVar16 + 4;
                  auVar20 = vfmadd213ps_fma(auVar21,auVar20,auVar25);
                } while ((long)uVar16 < (long)(int)(uVar7 & 0xfffffffc));
              }
              auVar21 = vshufpd_avx(auVar20,auVar20,1);
              auVar22 = ZEXT1664(auVar21);
              auVar24 = ZEXT1664(auVar20);
              if ((int)uVar16 < (int)uVar3) {
                uVar16 = uVar16 & 0xffffffff;
                lVar19 = 0;
                do {
                  auVar21 = vfmadd231ss_fma(auVar24._0_16_,ZEXT416((uint)pfVar9[uVar16 + lVar19]),
                                            ZEXT416((uint)pfVar13[uVar16 + lVar19]));
                  auVar24 = ZEXT1664(auVar21);
                  auVar21 = vfmadd231ss_fma(auVar22._0_16_,ZEXT416((uint)pfVar17[uVar16 + lVar19]),
                                            ZEXT416((uint)pfVar8[uVar16 + lVar19]));
                  auVar22 = ZEXT1664(auVar21);
                  lVar19 = lVar19 + 1;
                } while (uVar3 - uVar16 != lVar19);
              }
              auVar21 = vmovshdup_avx(auVar20);
              auVar20 = vshufps_avx(auVar20,auVar20,0xff);
              uVar18 = uVar18 + 1;
              pfVar11 = pfVar11 + uVar10;
              pfVar14 = pfVar14 + uVar10;
              pfVar17 = pfVar17 + uVar10;
              pfVar9 = pfVar9 + uVar10;
              *pfVar15 = (1.0 / fVar1) *
                         (auVar21._0_4_ + auVar24._0_4_) * (auVar20._0_4_ + auVar22._0_4_);
              pfVar15 = pfVar15 + 1;
            } while (uVar18 != uVar3);
          }
          lVar12 = lVar12 + 1;
          pfVar8 = pfVar8 + iVar4;
          pfVar13 = pfVar13 + iVar4;
        } while (lVar12 != endPattern);
      }
      local_c4 = local_c4 + iVar5 * iVar4;
      local_98 = local_98 + iVar6;
      local_a0 = local_a0 + iVar6;
      local_b0 = local_b0 + iVar6;
      local_b8 = local_b8 + iVar6;
      local_c0 = local_c0 + 1;
    } while (local_c0 != iVar2);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsFixedScaling(REALTYPE* destP,
                                                                         const REALTYPE* partials1,
                                                                         const REALTYPE* matrices1,
                                                                         const REALTYPE* partials2,
                                                                         const REALTYPE* matrices2,
                                                                         const REALTYPE* scaleFactors,
                                                                         int startPattern,
                                                                         int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE oneOverScaleFactor = REALTYPE(1.0) / scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B) * oneOverScaleFactor;
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}